

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O0

Expression *
soul::ExpressionHelpers::createStruct(Expression *__return_storage_ptr__,string *s,string *uid)

{
  Section local_68;
  string *local_20;
  string *uid_local;
  string *s_local;
  
  local_68.type = structure;
  local_20 = uid;
  uid_local = s;
  s_local = (string *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_68.text,(string *)s);
  std::__cxx11::string::string((string *)&local_68.referencedUID,(string *)uid);
  fromSection(__return_storage_ptr__,&local_68);
  SourceCodeModel::Expression::Section::~Section(&local_68);
  return __return_storage_ptr__;
}

Assistant:

static SourceCodeModel::Expression createStruct (std::string s, std::string uid)
    {
        return fromSection ({ SourceCodeModel::Expression::Section::Type::structure, std::move (s), std::move (uid) });
    }